

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
::emplace_decomposable<std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
          *this,shared_ptr<vmips::VirtReg> *key,shared_ptr<vmips::VirtReg> *args)

{
  size_t hashval;
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::iterator,_bool>
  local_40;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (key->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,8) +
            SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar3,0);
  uVar4 = (ulong)((((uint)(hashval >> 0x18) & 0xff ^
                   (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x30
                 );
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
  ::emplace_decomposable<std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>const&>
            (&local_40,
             (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
              *)(this + uVar4),key,hashval,args);
  lVar1 = *(long *)(this + uVar4);
  lVar2 = *(long *)(this + uVar4 + 0x18);
  (__return_storage_ptr__->first).inner_ = (Inner *)(this + uVar4);
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x300);
  (__return_storage_ptr__->first).it_.ctrl_ = local_40.first.ctrl_;
  (__return_storage_ptr__->first).it_.field_1 = local_40.first.field_1;
  (__return_storage_ptr__->first).it_end_.ctrl_ = (ctrl_t *)(lVar1 + lVar2);
  __return_storage_ptr__->second = local_40.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, Args&&... args)
    {
        size_t hashval = this->hash(key);
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        typename Lockable::UniqueLock m(inner);
        return make_rv(&inner, set.emplace_decomposable(key, hashval, std::forward<Args>(args)...));
    }